

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O3

void __thiscall raptor::TcpServer::OnErrorEvent(TcpServer *this,void *ptr)

{
  shared_ptr<raptor::Connection> con;
  IAcceptor local_28;
  IEpollReceiver local_20;
  
  if ((((ptr == (void *)0xffffffffffffffff) ||
       (this->_magic_number != (uint16_t)((ulong)ptr >> 0x30))) || ((uint32_t)ptr == 0xffffffff)) ||
     ((this->_options).max_connections <= ((ulong)ptr & 0xffffffff))) {
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/tcp_server.cc"
                   ,0xf3,kLogLevelError,"tcpserver: OnErrorEvent found invalid index, cid = %x",ptr)
    ;
    return;
  }
  GetConnection((TcpServer *)&stack0xffffffffffffffd8,(uint32_t)this);
  if ((Connection *)local_28._vptr_IAcceptor != (Connection *)0x0) {
    Connection::Shutdown((Connection *)local_28._vptr_IAcceptor,true);
    DeleteConnection(this,(uint32_t)ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._vptr_IEpollReceiver);
    return;
  }
  return;
}

Assistant:

void TcpServer::OnErrorEvent(void* ptr) {
    ConnectionId cid = (ConnectionId)ptr;
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        log_error("tcpserver: OnErrorEvent found invalid index, cid = %x", cid);
        return;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(true);
        DeleteConnection(index);
    }
}